

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_JUnitOutputTest_TestCaseBlockWithAssertions_TestShell::createTest
          (TEST_JUnitOutputTest_TestCaseBlockWithAssertions_TestShell *this)

{
  TEST_JUnitOutputTest_TestCaseBlockWithAssertions_Test *this_00;
  
  this_00 = (TEST_JUnitOutputTest_TestCaseBlockWithAssertions_Test *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x2b6);
  TEST_JUnitOutputTest_TestCaseBlockWithAssertions_Test::
  TEST_JUnitOutputTest_TestCaseBlockWithAssertions_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(JUnitOutputTest, TestCaseBlockWithAssertions)
{
    junitOutput->setPackageName("packagename");
    testCaseRunner->start()
            .withGroup("groupname")
            .withTest("testname")
            .thatHasChecks(24)
            .end();

    outputFile = fileSystem.file("cpputest_packagename_groupname.xml");

    STRCMP_EQUAL("<testcase classname=\"packagename.groupname\" name=\"testname\" assertions=\"24\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(5));
}